

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall
QWidgetRepaintManager::QWidgetRepaintManager(QWidgetRepaintManager *this,QWidget *topLevel)

{
  QBackingStore *pQVar1;
  undefined8 in_RSI;
  QWidget *in_RDI;
  
  *(undefined8 *)in_RDI = in_RSI;
  pQVar1 = QWidget::backingStore(in_RDI);
  *(QBackingStore **)&in_RDI->field_0x8 = pQVar1;
  QRegion::QRegion((QRegion *)&in_RDI->super_QPaintDevice);
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x3a4689);
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x3a4696);
  QRegion::QRegion((QRegion *)&in_RDI[1].data);
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x3a46b0);
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x3a46bd);
  *(undefined8 *)&in_RDI[3].field_0x8 = 0;
  in_RDI[3].super_QPaintDevice = (QPaintDevice)0x0;
  QElapsedTimer::QElapsedTimer((QElapsedTimer *)&in_RDI[3].field_0x18);
  *(undefined4 *)(in_RDI + 4) = 0;
  updateLists(this,topLevel);
  return;
}

Assistant:

QWidgetRepaintManager::QWidgetRepaintManager(QWidget *topLevel)
    : tlw(topLevel), store(tlw->backingStore())
{
    Q_ASSERT(store);

    // Ensure all existing subsurfaces and static widgets are added to their respective lists.
    updateLists(topLevel);
}